

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void ImPlot::AnnotateEx(double x,double y,bool clamp,ImVec4 *col,ImVec2 *off,char *fmt,
                       __va_list_tag *args)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ImVec4 *pIVar4;
  ImPlotContext *pIVar5;
  ImU32 bg;
  ImU32 fg;
  ImVec4 *pIVar6;
  ImVec2 pos;
  ImVec4 local_40;
  
  pIVar5 = GImPlot;
  if (GImPlot->CurrentPlot != (ImPlotPlot *)0x0) {
    pos = PlotToPixels(x,y,-1);
    bg = ImGui::GetColorU32(col);
    if ((col->w != 0.0) || (NAN(col->w))) {
      fg = -(uint)(col->z * 0.114 + col->x * 0.299 + col->y * 0.587 <= 0.5) | 0xff000000;
    }
    else {
      fVar1 = (GImPlot->Style).Colors[0xc].w;
      if ((fVar1 != -1.0) || (NAN(fVar1))) {
        pIVar6 = (GImPlot->Style).Colors + 0xc;
        pIVar4 = (GImPlot->Style).Colors + 0xc;
      }
      else {
        pIVar6 = ImGui::GetStyleColorVec4(0);
        pIVar4 = pIVar6;
      }
      local_40.x = pIVar6->x;
      local_40.y = pIVar6->y;
      uVar2 = pIVar4->z;
      uVar3 = pIVar4->w;
      local_40.z = (float)uVar2;
      local_40.w = (float)uVar3;
      fg = ImGui::ColorConvertFloat4ToU32(&local_40);
    }
    ImPlotAnnotationCollection::AppendV(&pIVar5->Annotations,&pos,off,bg,fg,clamp,fmt,args);
    return;
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"Annotate() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xae2,
                "void ImPlot::AnnotateEx(double, double, bool, const ImVec4 &, const ImVec2 &, const char *, __va_list_tag *)"
               );
}

Assistant:

void AnnotateEx(double x, double y, bool clamp, const ImVec4& col, const ImVec2& off, const char* fmt, va_list args) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "Annotate() needs to be called between BeginPlot() and EndPlot()!");
    ImVec2 pos = PlotToPixels(x,y);
    ImU32  bg  = ImGui::GetColorU32(col);
    ImU32  fg  = col.w == 0 ? GetStyleColorU32(ImPlotCol_InlayText) : CalcTextColor(col);
    gp.Annotations.AppendV(pos, off, bg, fg, clamp, fmt, args);
}